

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::cmState(cmState *this)

{
  unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
  local_30 [3];
  unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_> local_18;
  cmState *local_10;
  cmState *this_local;
  
  local_10 = this;
  std::
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::map(&this->PropertyDefinitions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->EnabledLanguages);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  ::map(&this->BuiltinCommands);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  ::map(&this->ScriptedCommands);
  cmPropertyMap::cmPropertyMap(&this->GlobalProperties);
  std::unique_ptr<cmCacheManager,std::default_delete<cmCacheManager>>::
  unique_ptr<std::default_delete<cmCacheManager>,void>
            ((unique_ptr<cmCacheManager,std::default_delete<cmCacheManager>> *)&this->CacheManager);
  std::unique_ptr<cmGlobVerificationManager,std::default_delete<cmGlobVerificationManager>>::
  unique_ptr<std::default_delete<cmGlobVerificationManager>,void>
            ((unique_ptr<cmGlobVerificationManager,std::default_delete<cmGlobVerificationManager>> *
             )&this->GlobVerificationManager);
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::cmLinkedTree
            (&this->BuildsystemDirectory);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  cmLinkedTree(&this->ExecutionListFiles);
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::cmLinkedTree(&this->PolicyStack);
  cmLinkedTree<cmStateDetail::SnapshotDataType>::cmLinkedTree(&this->SnapshotData);
  cmLinkedTree<cmDefinitions>::cmLinkedTree(&this->VarTree);
  std::__cxx11::string::string((string *)&this->SourceDirectory);
  std::__cxx11::string::string((string *)&this->BinaryDirectory);
  this->IsInTryCompile = false;
  this->IsGeneratorMultiConfig = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->GhsMultiIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  this->MSYSShell = false;
  this->CurrentMode = Unknown;
  std::make_unique<cmCacheManager>();
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::operator=
            (&this->CacheManager,&local_18);
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::~unique_ptr(&local_18);
  std::make_unique<cmGlobVerificationManager>();
  std::unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  operator=(&this->GlobVerificationManager,local_30);
  std::unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  ~unique_ptr(local_30);
  return;
}

Assistant:

cmState::cmState()
{
  this->CacheManager = cm::make_unique<cmCacheManager>();
  this->GlobVerificationManager = cm::make_unique<cmGlobVerificationManager>();
}